

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int spi_open(int pi,uint channel,uint speed,uint32_t flags)

{
  int iVar1;
  int in_ECX;
  gpioExtent_t *unaff_retaddr;
  int in_stack_00000008;
  gpioExtent_t ext [1];
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  iVar1 = pigpio_command_ext(in_ECX,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                             (int)((ulong)&stack0xfffffffffffffff0 >> 0x20),
                             (int)&stack0xfffffffffffffff0,0,unaff_retaddr,in_stack_00000008);
  return iVar1;
}

Assistant:

int spi_open(int pi, unsigned channel, unsigned speed, uint32_t flags)
{
   gpioExtent_t ext[1];

   /*
   p1=channel
   p2=speed
   p3=4
   ## extension ##
   uint32_t flags
   */

   ext[0].size = sizeof(uint32_t);
   ext[0].ptr = &flags;

   return pigpio_command_ext
      (pi, PI_CMD_SPIO, channel, speed, 4, 1, ext, 1);
}